

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

int sysbvm_integer_compare(sysbvm_context_t *context,sysbvm_tuple_t left,sysbvm_tuple_t right)

{
  _Bool _Var1;
  sysbvm_stuple_t sVar2;
  sysbvm_stuple_t sVar3;
  int local_7c;
  undefined1 local_78 [4];
  int magnitudeComparison;
  sysbvm_decoded_integer_t decodedRightInteger;
  sysbvm_decoded_integer_t decodedLeftInteger;
  sysbvm_stuple_t rightValue;
  sysbvm_stuple_t leftValue;
  sysbvm_tuple_t right_local;
  sysbvm_tuple_t left_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isImmediate(left);
  if ((_Var1) && (_Var1 = sysbvm_tuple_isImmediate(right), _Var1)) {
    sVar2 = sysbvm_tuple_integer_decodeSmall(left);
    sVar3 = sysbvm_tuple_integer_decodeSmall(right);
    if (sVar2 < sVar3) {
      context_local._4_4_ = -1;
    }
    else if (sVar3 < sVar2) {
      context_local._4_4_ = 1;
    }
    else {
      context_local._4_4_ = 0;
    }
  }
  else {
    memset(decodedRightInteger.inlineWordBuffer,0,0x20);
    memset(local_78,0,0x20);
    sysbvm_integer_decodeLargeOrImmediate
              (context,(sysbvm_decoded_integer_t *)decodedRightInteger.inlineWordBuffer,left);
    sysbvm_integer_decodeLargeOrImmediate(context,(sysbvm_decoded_integer_t *)local_78,right);
    if (((byte)decodedRightInteger.inlineWordBuffer[0] & 1) == (local_78[0] & 1U)) {
      local_7c = sysbvm_integer_compareMagnitudes
                           (decodedLeftInteger._0_8_,(uint32_t *)decodedLeftInteger.wordCount,
                            decodedRightInteger._0_8_,(uint32_t *)decodedRightInteger.wordCount);
      if (((byte)decodedRightInteger.inlineWordBuffer[0] & 1) != 0) {
        local_7c = -local_7c;
      }
      context_local._4_4_ = local_7c;
    }
    else if (((byte)decodedRightInteger.inlineWordBuffer[0] & 1) == 0) {
      context_local._4_4_ = 1;
    }
    else {
      context_local._4_4_ = -1;
    }
  }
  return context_local._4_4_;
}

Assistant:

SYSBVM_API int sysbvm_integer_compare(sysbvm_context_t *context, sysbvm_tuple_t left, sysbvm_tuple_t right)
{
    if(sysbvm_tuple_isImmediate(left) && sysbvm_tuple_isImmediate(right))
    {
        sysbvm_stuple_t leftValue = sysbvm_tuple_integer_decodeSmall(left);
        sysbvm_stuple_t rightValue = sysbvm_tuple_integer_decodeSmall(right);
        if(leftValue < rightValue)
            return -1;
        else if(leftValue > rightValue)
            return 1;
        else
            return 0;
    }

    sysbvm_decoded_integer_t decodedLeftInteger = {0};
    sysbvm_decoded_integer_t decodedRightInteger = {0};
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedLeftInteger, left);
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedRightInteger, right);

    // Check the differing signs.
    if(decodedLeftInteger.isNegative != decodedRightInteger.isNegative)
    {
        if(decodedLeftInteger.isNegative)
            return -1;
        else
            return 1;
    }

    // Check the word count.
    int magnitudeComparison = sysbvm_integer_compareMagnitudes(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words);
    if(decodedLeftInteger.isNegative)
        magnitudeComparison = -magnitudeComparison;

    return magnitudeComparison;
}